

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

void leaveblock(FuncState *fs)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  LexState *ls;
  BlockCnt *pBVar5;
  Dyndata *pDVar6;
  FuncState *fs_00;
  Instruction *pIVar7;
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  LocVar *pLVar11;
  TString *name;
  Labeldesc *pLVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint nvar;
  int list;
  long lVar17;
  Labeldesc *pLVar18;
  int iVar19;
  ulong uVar20;
  Dyndata *pDVar21;
  LexState *local_70;
  long local_60;
  
  ls = fs->ls;
  pBVar5 = fs->bl;
  nvar = (uint)pBVar5->nactvar;
  bVar9 = reglevel(fs,(uint)pBVar5->nactvar);
  local_70 = ls;
  if ((pBVar5->previous != (BlockCnt *)0x0) && (pBVar5->upval != '\0')) {
    luaK_codeABCk(fs,OP_CLOSE,(uint)bVar9,0,0,0);
    nvar = (uint)pBVar5->nactvar;
    local_70 = fs->ls;
  }
  fs->freereg = bVar9;
  uVar16 = (uint)fs->nactvar;
  pDVar21 = local_70->dyd;
  piVar1 = &(pDVar21->actvar).n;
  *piVar1 = *piVar1 + (nvar - fs->nactvar);
  while (nvar < uVar16) {
    uVar16 = uVar16 - 1;
    fs->nactvar = (lu_byte)uVar16;
    pLVar11 = localdebuginfo(fs,uVar16 & 0xff);
    if (pLVar11 != (LocVar *)0x0) {
      pLVar11->endpc = fs->pc;
    }
  }
  if (pBVar5->isloop == '\x02') {
    name = luaS_newlstr(ls->L,"break",5);
    createlabel(ls,name,0,0);
    local_70 = fs->ls;
    pDVar21 = local_70->dyd;
    nvar = (uint)pBVar5->nactvar;
  }
  bVar9 = reglevel(fs,nvar);
  uVar20 = (ulong)pBVar5->firstgoto;
  local_60 = uVar20 * 0x18;
  do {
    iVar19 = (int)uVar20;
    lVar17 = (long)iVar19;
    while( true ) {
      if ((pDVar21->gt).n <= iVar19) {
        (local_70->dyd->label).n = pBVar5->firstlabel;
        if (pBVar5->previous == (BlockCnt *)0x0) {
          if (pBVar5->firstgoto < (ls->dyd->gt).n) {
            undefgoto(ls,(ls->dyd->gt).arr + pBVar5->firstgoto);
          }
        }
        fs->bl = pBVar5->previous;
        return;
      }
      pLVar18 = (pDVar21->gt).arr;
      pLVar12 = findlabel(local_70,pLVar18[lVar17].name,pBVar5->firstlabel);
      if (pLVar12 == (Labeldesc *)0x0) break;
      pDVar6 = local_70->dyd;
      pLVar18 = (pDVar6->gt).arr;
      bVar10 = pLVar18[lVar17].nactvar;
      pLVar18 = pLVar18 + lVar17;
      bVar4 = pLVar12->nactvar;
      if (bVar10 < bVar4) {
        jumpscopeerror(local_70,pLVar18);
      }
      fs_00 = local_70->fs;
      if ((pLVar18->close == '\0') && ((pBVar5->upval == '\0' || (bVar10 <= bVar4)))) {
        list = pLVar18->pc;
      }
      else {
        bVar10 = reglevel(fs_00,(uint)bVar4);
        pIVar7 = fs_00->f->code;
        pIVar7[(long)pLVar18->pc + 1] = pIVar7[pLVar18->pc];
        pIVar7[pLVar18->pc] = (uint)bVar10 << 7 | 0x36;
        list = pLVar18->pc + 1;
        pLVar18->pc = list;
      }
      luaK_patchlist(fs_00,list,pLVar12->pc);
      lVar13 = local_60;
      for (lVar14 = lVar17; lVar15 = (long)(pDVar6->gt).n + -1, lVar14 < lVar15; lVar14 = lVar14 + 1
          ) {
        pLVar18 = (pDVar6->gt).arr;
        *(undefined8 *)(&pLVar18->nactvar + lVar13) = *(undefined8 *)(&pLVar18[1].nactvar + lVar13);
        puVar3 = (undefined8 *)((long)&pLVar18[1].name + lVar13);
        uVar8 = puVar3[1];
        puVar2 = (undefined8 *)((long)&pLVar18->name + lVar13);
        *puVar2 = *puVar3;
        puVar2[1] = uVar8;
        lVar13 = lVar13 + 0x18;
      }
      (pDVar6->gt).n = (int)lVar15;
    }
    if ((pBVar5->upval != '\0') &&
       (bVar10 = reglevel(fs,(uint)pLVar18[lVar17].nactvar), bVar9 < bVar10)) {
      pLVar18[lVar17].close = '\x01';
    }
    pLVar18[lVar17].nactvar = pBVar5->nactvar;
    uVar20 = (ulong)(iVar19 + 1);
    local_60 = local_60 + 0x18;
  } while( true );
}

Assistant:

static void leaveblock (FuncState *fs) {
  BlockCnt *bl = fs->bl;
  LexState *ls = fs->ls;
  lu_byte stklevel = reglevel(fs, bl->nactvar);  /* level outside block */
  if (bl->previous && bl->upval)  /* need a 'close'? */
    luaK_codeABC(fs, OP_CLOSE, stklevel, 0, 0);
  fs->freereg = stklevel;  /* free registers */
  removevars(fs, bl->nactvar);  /* remove block locals */
  lua_assert(bl->nactvar == fs->nactvar);  /* back to level on entry */
  if (bl->isloop == 2)  /* has to fix pending breaks? */
    createlabel(ls, luaS_newliteral(ls->L, "break"), 0, 0);
  solvegotos(fs, bl);
  if (bl->previous == NULL) {  /* was it the last block? */
    if (bl->firstgoto < ls->dyd->gt.n)  /* still pending gotos? */
      undefgoto(ls, &ls->dyd->gt.arr[bl->firstgoto]);  /* error */
  }
  fs->bl = bl->previous;  /* current block now is previous one */
}